

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::throw_exception(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *this)

{
  long *plVar1;
  undefined8 *puVar2;
  parse_error *__return_storage_ptr__;
  char *pcVar3;
  ulong *puVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  string error_msg;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  string local_88;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48 [2];
  size_type local_38 [2];
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"syntax error - ","");
  if (this->last_token == parse_error) {
    std::__cxx11::string::string((string *)local_48,(this->m_lexer).error_message,&local_e9);
    plVar1 = (long *)std::__cxx11::string::append((char *)local_48);
    local_a8 = (ulong *)*plVar1;
    puVar4 = (ulong *)(plVar1 + 2);
    if (local_a8 == puVar4) {
      local_98 = *puVar4;
      lStack_90 = plVar1[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *puVar4;
    }
    local_a0 = plVar1[1];
    *plVar1 = (long)puVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string(&local_88,&this->m_lexer);
    uVar6 = 0xf;
    if (local_a8 != &local_98) {
      uVar6 = local_98;
    }
    if (uVar6 < local_88._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar7 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_88._M_string_length + local_a0) goto LAB_0014929a;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
    }
    else {
LAB_0014929a:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    }
    local_c8._M_dataplus._M_p = (pointer)*puVar2;
    psVar5 = puVar2 + 2;
    if ((size_type *)local_c8._M_dataplus._M_p == psVar5) {
      local_c8.field_2._M_allocated_capacity = *psVar5;
      local_c8.field_2._8_8_ = puVar2[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar5;
    }
    local_c8._M_string_length = puVar2[1];
    *puVar2 = psVar5;
    puVar2[1] = 0;
    *(undefined1 *)psVar5 = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_e8._M_dataplus._M_p = (pointer)*plVar1;
    psVar5 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_e8._M_dataplus._M_p == psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = plVar1[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
    }
    local_e8._M_string_length = plVar1[1];
    *plVar1 = (long)psVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_48[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38) goto LAB_00149317;
  }
  else {
    pcVar3 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::token_type_name(this->last_token);
    std::__cxx11::string::string((string *)&local_c8,pcVar3,(allocator *)&local_a8);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x15c140);
    local_e8._M_dataplus._M_p = (pointer)*plVar1;
    psVar5 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_e8._M_dataplus._M_p == psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = plVar1[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
    }
    local_e8._M_string_length = plVar1[1];
    *plVar1 = (long)psVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    local_38[0] = local_c8.field_2._M_allocated_capacity;
    local_48[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_00149317;
  }
  operator_delete(local_48[0],local_38[0] + 1);
LAB_00149317:
  if (this->expected != uninitialized) {
    pcVar3 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::token_type_name(this->expected);
    std::__cxx11::string::string((string *)&local_c8,pcVar3,(allocator *)&local_a8);
    std::operator+(&local_e8,"; expected ",&local_c8);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  __return_storage_ptr__ = (parse_error *)__cxa_allocate_exception(0x28);
  parse_error::create(__return_storage_ptr__,0x65,(this->m_lexer).chars_read,&local_68);
  __cxa_throw(__return_storage_ptr__,&parse_error::typeinfo,exception::~exception);
}

Assistant:

[[noreturn]] void throw_exception() const
    {
        std::string error_msg = "syntax error - ";
        if (last_token == token_type::parse_error)
        {
            error_msg += std::string(m_lexer.get_error_message()) + "; last read: '" +
                         m_lexer.get_token_string() + "'";
        }
        else
        {
            error_msg += "unexpected " + std::string(lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += "; expected " + std::string(lexer_t::token_type_name(expected));
        }

        JSON_THROW(parse_error::create(101, m_lexer.get_position(), error_msg));
    }